

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_WriteDependencyManifestFileGivenTwoInputs_Test::
~CommandLineInterfaceTest_WriteDependencyManifestFileGivenTwoInputs_Test
          (CommandLineInterfaceTest_WriteDependencyManifestFileGivenTwoInputs_Test *this)

{
  CommandLineInterfaceTest_WriteDependencyManifestFileGivenTwoInputs_Test *this_local;
  
  ~CommandLineInterfaceTest_WriteDependencyManifestFileGivenTwoInputs_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, WriteDependencyManifestFileGivenTwoInputs) {
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");
  CreateTempFile("bar.proto",
                 "syntax = \"proto2\";\n"
                 "import \"foo.proto\";\n"
                 "message Bar {\n"
                 "  optional Foo foo = 1;\n"
                 "}\n");

  Run("protocol_compiler --dependency_out=$tmpdir/manifest "
      "--test_out=$tmpdir --proto_path=$tmpdir bar.proto foo.proto");

  ExpectErrorText(
      "Can only process one input file when using --dependency_out=FILE.\n");
}